

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_set.hpp
# Opt level: O2

bool Omega_h::intersects<int>
               (set<int,_std::less<int>,_std::allocator<int>_> *a,
               set<int,_std::less<int>,_std::allocator<int>_> *b)

{
  iterator iVar1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  
  p_Var3 = &(b->_M_t)._M_impl.super__Rb_tree_header;
  for (p_Var2 = (b->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != p_Var3; p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    iVar1 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::find
                      (&a->_M_t,(key_type *)(p_Var2 + 1));
    if ((_Rb_tree_header *)iVar1._M_node != &(a->_M_t)._M_impl.super__Rb_tree_header) break;
  }
  return (_Rb_tree_header *)p_Var2 != p_Var3;
}

Assistant:

bool intersects(std::set<T>& a, std::set<T> const& b) {
  for (auto& x : b) {
    auto it = a.find(x);
    if (it != a.end()) return true;
  }
  return false;
}